

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_extended_test.cc
# Opt level: O2

void test_multi_readers(multi_reader_type reader_type,char *test_name)

{
  pointer ppfVar1;
  multi_reader_type mVar2;
  fdb_status fVar3;
  reference ppfVar4;
  allocator_type *__a;
  code *__start_routine;
  int i;
  pthread_t *ppVar5;
  size_type __n;
  char *__format;
  pthread_t *__newthread;
  int iVar6;
  long lVar7;
  int local_218 [2];
  long alStack_210 [4];
  undefined4 auStack_1f0 [14];
  fdb_doc_struct *local_1b8 [2];
  pthread_t local_1a8;
  undefined1 *puStack_1a0;
  undefined1 local_198 [8];
  fdb_config fconfig;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  undefined1 local_70 [8];
  vector<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_> docs;
  fdb_file_handle *local_48;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  
  puStack_1a0 = (undefined1 *)0x1041a9;
  db._0_4_ = reader_type;
  gettimeofday((timeval *)&fconfig.num_blocks_readahead,(__timezone_ptr_t)0x0);
  puStack_1a0 = (undefined1 *)0x1041ae;
  memleak_start();
  puStack_1a0 = (undefined1 *)0x1041ba;
  system("rm -rf  test.fdb* > errorlog.txt");
  puStack_1a0 = (undefined1 *)0x1041c9;
  getDefaultConfig();
  puStack_1a0 = (undefined1 *)0x1041d5;
  fdb_get_default_kvs_config();
  puStack_1a0 = (undefined1 *)0x1041e8;
  fVar3 = fdb_open(&local_48,test_filename,(fdb_config *)local_198);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    puStack_1a0 = (undefined1 *)0x1043d9;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
            ,0x20b);
    test_multi_readers(multi_reader_type,char_const*)::__test_pass = 1;
    puStack_1a0 = (undefined1 *)0x1043fb;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
                  ,0x20b,"void test_multi_readers(multi_reader_type, const char *)");
  }
  puStack_1a0 = (undefined1 *)0x104204;
  fVar3 = fdb_kvs_open_default
                    (local_48,(fdb_kvs_handle **)&dbfile,(fdb_kvs_config *)&__test_begin.tv_usec);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    puStack_1a0 = (undefined1 *)0x104223;
    fVar3 = fdb_set_log_callback((fdb_kvs_handle *)dbfile,logCallbackFunc,"multi_reader_thread");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      kvs_config.custom_cmp_param = (void *)0x0;
      __a = (allocator_type *)((long)&db + 7);
      puStack_1a0 = (undefined1 *)0x104248;
      std::vector<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_>::vector
                ((vector<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_> *)local_70,100000,
                 (value_type *)&kvs_config.custom_cmp_param,__a);
      puStack_1a0 = (undefined1 *)0x104258;
      loadDocsWithRandomKeys
                (local_48,(fdb_kvs_handle *)dbfile,
                 (vector<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_> *)local_70,(int)__a);
      puStack_1a0 = (undefined1 *)0x104261;
      fdb_kvs_close((fdb_kvs_handle *)dbfile);
      puStack_1a0 = (undefined1 *)0x10426a;
      fdb_close(local_48);
      docs.super__Vector_base<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_1b8;
      iVar6 = 0;
      ppVar5 = &local_1a8;
      for (lVar7 = 0; mVar2 = (multi_reader_type)db,
          ppfVar1 = docs.super__Vector_base<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage, lVar7 != 0x60;
          lVar7 = lVar7 + 0x30) {
        *(int *)((long)local_218 + lVar7) = iVar6;
        *(undefined8 *)((long)alStack_210 + lVar7) = 100000;
        *(undefined1 **)((long)alStack_210 + lVar7 + 8) = local_70;
        *(undefined1 **)((long)alStack_210 + lVar7 + 0x10) = local_198;
        *(__suseconds_t **)((long)alStack_210 + lVar7 + 0x18) = &__test_begin.tv_usec;
        *(undefined4 *)((long)auStack_1f0 + lVar7) = 1;
        __newthread = ppVar5;
        if ((mVar2 == MULTI_SNAPSHOT_READERS) ||
           ((mVar2 != MULTI_READERS && (__newthread = &local_1a8, lVar7 == 0)))) {
          __start_routine = _snapshot_reader_thread;
        }
        else {
          __start_routine = _reader_thread;
          __newthread = ppVar5;
        }
        pthread_create(__newthread,(pthread_attr_t *)0x0,__start_routine,
                       (void *)((long)local_218 + lVar7));
        iVar6 = iVar6 + 1;
        ppVar5 = ppVar5 + 1;
      }
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 8) {
        pthread_join(*(pthread_t *)((long)&local_1a8 + lVar7),(void **)((long)ppfVar1 + lVar7));
      }
      for (__n = 0; __n != 100000; __n = __n + 1) {
        ppfVar4 = std::vector<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_>::at
                            ((vector<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_> *)local_70
                             ,__n);
        fdb_doc_free(*ppfVar4);
      }
      fdb_shutdown();
      memleak_end();
      __format = "%s PASSED\n";
      if (test_multi_readers(multi_reader_type,char_const*)::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,test_name);
      std::_Vector_base<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_>::~_Vector_base
                ((_Vector_base<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_> *)local_70);
      return;
    }
    puStack_1a0 = (undefined1 *)0x10446b;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
            ,0x211);
    test_multi_readers(multi_reader_type,char_const*)::__test_pass = 1;
    puStack_1a0 = &LAB_0010448d;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
                  ,0x211,"void test_multi_readers(multi_reader_type, const char *)");
  }
  puStack_1a0 = (undefined1 *)0x104422;
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
          ,0x20d);
  test_multi_readers(multi_reader_type,char_const*)::__test_pass = 1;
  puStack_1a0 = (undefined1 *)0x104444;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
                ,0x20d,"void test_multi_readers(multi_reader_type, const char *)");
}

Assistant:

static void test_multi_readers(multi_reader_type reader_type,
                               const char *test_name) {
    TEST_INIT();
    memleak_start();

    int r;
    int num_docs = 100000;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;
    size_t n_readers = num_readers;

    // remove previous extended_test files
    r = system(SHELL_DEL" test.fdb* > errorlog.txt");
    (void)r;

    fdb_config fconfig = getDefaultConfig();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    status = fdb_open(&dbfile, test_filename, &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "multi_reader_thread");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create a vector of docs on the heap
    std::vector<fdb_doc *> docs(num_docs, nullptr);

    // Load the initial documents with random keys.
    loadDocsWithRandomKeys(dbfile, db, &docs, num_docs);
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // create reader threads.
    thread_t *tid = alca(thread_t, n_readers);
    void **thread_ret = alca(void *, n_readers);
    struct reader_thread_args *args = alca(struct reader_thread_args, n_readers);
    for (size_t i = 0; i < n_readers; ++i){
        args[i].tid = i;
        args[i].ndocs = num_docs;
        args[i].docs = &docs;
        args[i].config = &fconfig;
        args[i].kvs_config = &kvs_config;
        args[i].check_body = 1;
        if (reader_type == MULTI_READERS) {
            thread_create(&tid[i], _reader_thread, &args[i]);
        } else if (reader_type == MULTI_SNAPSHOT_READERS) {
            thread_create(&tid[i], _snapshot_reader_thread, &args[i]);
        } else { // mixed
            if (i % 2) {
                thread_create(&tid[i], _reader_thread, &args[i]);
            } else {
                thread_create(&tid[i], _snapshot_reader_thread, &args[i]);
            }
        }
    }

    // wait for thread termination
    for (size_t i = 0; i < n_readers; ++i){
        thread_join(tid[i], &thread_ret[i]);
    }

    // free all documents
    for (int i = 0 ; i < num_docs; ++i){
        fdb_doc_free(docs.at(i));
    }

    // shutdown
    fdb_shutdown();

    memleak_end();
    TEST_RESULT(test_name);
}